

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void ARM_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  bool bVar4;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  MCOperand *pMVar8;
  int64_t iVar9;
  char *pcVar10;
  MCRegisterClass *pMVar11;
  MCOperand *pMVar12;
  MCOperand *pMVar13;
  MCOperand *op;
  ulong uVar14;
  uint64_t uVar15;
  uint uVar16;
  MCInst NewMI;
  MCInst local_360;
  
  uVar6 = MCInst_getOpcode(MI);
  if ((int)uVar6 < 0x1ba) {
    if ((int)uVar6 < 0xe2) {
      if ((int)uVar6 < 0x94) {
        if (uVar6 == 0x6f) goto LAB_0015913c;
        if (uVar6 != 0x7b) goto switchD_00159166_default;
      }
      else {
        if (uVar6 == 0x94) goto LAB_001590d3;
        if (uVar6 != 0xa5) {
          if (uVar6 != 0xbc) goto switchD_00159166_default;
          pMVar8 = MCInst_getOperand(MI,2);
          uVar6 = MCOperand_getReg(pMVar8);
          if (uVar6 != 0xc) goto switchD_00159166_default;
          pMVar8 = MCInst_getOperand(MI,4);
          iVar9 = MCOperand_getImm(pMVar8);
          if (((((uint)iVar9 >> 0xc & 1) != 0) ||
              (iVar9 = MCOperand_getImm(pMVar8), ((uint)iVar9 & 0xfff) != 4)) &&
             (iVar9 = MCOperand_getImm(pMVar8), iVar9 != 4)) goto switchD_00159166_default;
          SStream_concat0(O,"pop");
          MCInst_setOpcodePub(MI,0x1a9);
          printPredicateOperand(MI,5,O);
          SStream_concat0(O,"\t{");
          pcVar2 = MI->csh;
          pMVar8 = MCInst_getOperand(MI,0);
          uVar6 = MCOperand_getReg(pMVar8);
          pcVar10 = (*pcVar2->get_regname)(uVar6);
          SStream_concat0(O,pcVar10);
          if (MI->csh->detail == CS_OPT_OFF) goto LAB_00159450;
          pcVar3 = MI->flat_insn->detail;
          puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar6 = 0;
          goto LAB_00159418;
        }
      }
    }
    else {
      if ((int)uVar6 < 0x192) {
        if (uVar6 == 0xe2) {
          pMVar8 = MCInst_getOperand(MI,0);
          pMVar12 = MCInst_getOperand(MI,1);
          pMVar13 = MCInst_getOperand(MI,2);
          iVar9 = MCOperand_getImm(pMVar13);
          uVar6 = ((uint)iVar9 & 7) - 1;
          if (uVar6 < 5) {
            pcVar10 = *(char **)(&DAT_002828e0 + (ulong)uVar6 * 8);
          }
          else {
            pcVar10 = anon_var_dwarf_e9ec9 + 0x11;
          }
          SStream_concat0(O,pcVar10);
          printSBitModifierOperand(MI,5,O);
          printPredicateOperand(MI,3,O);
          SStream_concat0(O,anon_var_dwarf_73666 + 0x11);
          pcVar2 = MI->csh;
          uVar6 = MCOperand_getReg(pMVar8);
          pcVar10 = (*pcVar2->get_regname)(uVar6);
          SStream_concat0(O,pcVar10);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar3 = MI->flat_insn->detail;
            puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
            puVar1[0] = '\x01';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            uVar6 = MCOperand_getReg(pMVar8);
            pcVar3 = MI->flat_insn->detail;
            *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
            puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
            *puVar1 = *puVar1 + '\x01';
          }
          SStream_concat0(O,", ");
          pcVar2 = MI->csh;
          uVar6 = MCOperand_getReg(pMVar12);
          pcVar10 = (*pcVar2->get_regname)(uVar6);
          SStream_concat0(O,pcVar10);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar3 = MI->flat_insn->detail;
            puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
            puVar1[0] = '\x01';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            uVar6 = MCOperand_getReg(pMVar12);
            pcVar3 = MI->flat_insn->detail;
            *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
            puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
            *puVar1 = *puVar1 + '\x01';
          }
          iVar9 = MCOperand_getImm(pMVar13);
          if (((uint)iVar9 & 7) == 5) {
            return;
          }
          SStream_concat0(O,", ");
          uVar14 = MCOperand_getImm(pMVar13);
          uVar6 = 0x20;
          if (7 < (uint)uVar14) {
            uVar6 = (uint)(uVar14 >> 3) & 0x1fffffff;
          }
          pcVar10 = ", #%u";
          if (9 < uVar6) {
            pcVar10 = ", #0x%x";
          }
          SStream_concat(O,pcVar10 + 2,(ulong)uVar6);
          if (MI->csh->detail == CS_OPT_OFF) {
            return;
          }
          iVar9 = MCOperand_getImm(pMVar13);
          pcVar3 = MI->flat_insn->detail;
          *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x12) =
               (uint)iVar9 & 7;
          pcVar3 = MI->flat_insn->detail;
          *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x16) = uVar6;
          return;
        }
        if (uVar6 == 0xe3) {
          pMVar8 = MCInst_getOperand(MI,0);
          pMVar12 = MCInst_getOperand(MI,1);
          pMVar13 = MCInst_getOperand(MI,2);
          op = MCInst_getOperand(MI,3);
          iVar9 = MCOperand_getImm(op);
          uVar6 = ((uint)iVar9 & 7) - 1;
          if (uVar6 < 5) {
            pcVar10 = *(char **)(&DAT_002828e0 + (ulong)uVar6 * 8);
          }
          else {
            pcVar10 = anon_var_dwarf_e9ec9 + 0x11;
          }
          SStream_concat0(O,pcVar10);
          printSBitModifierOperand(MI,6,O);
          printPredicateOperand(MI,4,O);
          SStream_concat0(O,anon_var_dwarf_73666 + 0x11);
          pcVar2 = MI->csh;
          uVar6 = MCOperand_getReg(pMVar8);
          pcVar10 = (*pcVar2->get_regname)(uVar6);
          SStream_concat0(O,pcVar10);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar3 = MI->flat_insn->detail;
            puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
            puVar1[0] = '\x01';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            uVar6 = MCOperand_getReg(pMVar8);
            pcVar3 = MI->flat_insn->detail;
            *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
            puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
            *puVar1 = *puVar1 + '\x01';
          }
          SStream_concat0(O,", ");
          pcVar2 = MI->csh;
          uVar6 = MCOperand_getReg(pMVar12);
          pcVar10 = (*pcVar2->get_regname)(uVar6);
          SStream_concat0(O,pcVar10);
          if (MI->csh->detail != CS_OPT_OFF) {
            pcVar3 = MI->flat_insn->detail;
            puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
            puVar1[0] = '\x01';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            uVar6 = MCOperand_getReg(pMVar12);
            pcVar3 = MI->flat_insn->detail;
            *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
            puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
            *puVar1 = *puVar1 + '\x01';
          }
          SStream_concat0(O,", ");
          pcVar2 = MI->csh;
          uVar6 = MCOperand_getReg(pMVar13);
          pcVar10 = (*pcVar2->get_regname)(uVar6);
          SStream_concat0(O,pcVar10);
          if (MI->csh->detail == CS_OPT_OFF) {
            return;
          }
          pcVar3 = MI->flat_insn->detail;
          puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar6 = MCOperand_getReg(pMVar13);
          pcVar3 = MI->flat_insn->detail;
          *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
          puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
          *puVar1 = *puVar1 + '\x01';
          return;
        }
        goto switchD_00159166_default;
      }
      if (uVar6 != 0x192) {
        if (uVar6 == 0x198) goto LAB_0015917a;
        if (uVar6 != 0x1ad) goto switchD_00159166_default;
      }
    }
    pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,1);
    pMVar8 = MCInst_getOperand(MI,(uint)(uVar6 == 0x192 || uVar6 == 0x1ad));
    uVar7 = MCOperand_getReg(pMVar8);
    _Var5 = MCRegisterClass_contains(pMVar11,uVar7);
    if (_Var5) {
      MCInst_Init(&local_360);
      MCInst_setOpcode(&local_360,uVar6);
      if ((uVar6 == 0x1ad) || (uVar16 = 2, uVar6 == 0x192)) {
        pMVar8 = MCInst_getOperand(MI,0);
        MCInst_addOperand2(&local_360,pMVar8);
        uVar16 = 3;
      }
      pMVar11 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x12);
      uVar6 = MCRegisterInfo_getMatchingSuperReg((MCRegisterInfo *)Info,uVar7,9,pMVar11);
      MCOperand_CreateReg0(&local_360,uVar6);
      uVar6 = MCInst_getNumOperands(MI);
      if (uVar16 < uVar6) {
        do {
          pMVar8 = MCInst_getOperand(MI,uVar16);
          MCInst_addOperand2(&local_360,pMVar8);
          uVar16 = uVar16 + 1;
          uVar6 = MCInst_getNumOperands(MI);
        } while (uVar16 < uVar6);
      }
      printInstruction(&local_360,O,(MCRegisterInfo *)Info);
      return;
    }
    goto switchD_00159166_default;
  }
  if ((int)uVar6 < 0x921) {
    if ((int)uVar6 < 0x4e4) {
      if (uVar6 == 0x1ba) {
        pMVar8 = MCInst_getOperand(MI,2);
        uVar6 = MCOperand_getReg(pMVar8);
        if (uVar6 != 0xc) goto switchD_00159166_default;
        pMVar8 = MCInst_getOperand(MI,3);
        iVar9 = MCOperand_getImm(pMVar8);
        if (iVar9 != -4) goto switchD_00159166_default;
        SStream_concat0(O,"push");
        MCInst_setOpcodePub(MI,0x1aa);
        printPredicateOperand(MI,4,O);
        SStream_concat0(O,"\t{");
        pcVar2 = MI->csh;
        pMVar8 = MCInst_getOperand(MI,1);
        uVar6 = MCOperand_getReg(pMVar8);
        pcVar10 = (*pcVar2->get_regname)(uVar6);
        SStream_concat0(O,pcVar10);
        if (MI->csh->detail == CS_OPT_OFF) goto LAB_00159450;
        pcVar3 = MI->flat_insn->detail;
        puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = 1;
LAB_00159418:
        pMVar8 = MCInst_getOperand(MI,uVar6);
        uVar6 = MCOperand_getReg(pMVar8);
        pcVar3 = MI->flat_insn->detail;
        *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
        puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
        *puVar1 = *puVar1 + '\x01';
LAB_00159450:
        SStream_concat0(O,"}");
        return;
      }
      if (uVar6 != 0x4e0) goto switchD_00159166_default;
LAB_00158fe2:
      pMVar8 = MCInst_getOperand(MI,0);
      uVar6 = MCOperand_getReg(pMVar8);
      if (uVar6 != 0xc) goto switchD_00159166_default;
      SStream_concat0(O,"vpop");
      uVar6 = 0x1b2;
    }
    else {
      if (uVar6 == 0x4e4) goto LAB_00158fe2;
      if ((uVar6 != 0x87c) && (uVar6 != 0x880)) goto switchD_00159166_default;
      pMVar8 = MCInst_getOperand(MI,0);
      uVar6 = MCOperand_getReg(pMVar8);
      if (uVar6 != 0xc) goto switchD_00159166_default;
      SStream_concat0(O,"vpush");
      uVar6 = 0x1b1;
    }
    MCInst_setOpcodePub(MI,uVar6);
    printPredicateOperand(MI,2,O);
LAB_00159029:
    SStream_concat0(O,anon_var_dwarf_73666 + 0x11);
    uVar6 = 4;
LAB_00159324:
    printRegisterList(MI,uVar6,O);
    return;
  }
  if ((int)uVar6 < 0xa24) {
    if (uVar6 != 0x921) {
      if (uVar6 != 0x941) goto switchD_00159166_default;
LAB_001590d3:
      pMVar8 = MCInst_getOperand(MI,0);
      uVar7 = MCOperand_getReg(pMVar8);
      if ((uVar7 != 0xc) || (uVar7 = MCInst_getNumOperands(MI), uVar7 < 6))
      goto switchD_00159166_default;
      SStream_concat0(O,"pop");
      MCInst_setOpcodePub(MI,0x1a9);
      printPredicateOperand(MI,2,O);
      if (uVar6 == 0x941) goto LAB_001591de;
      goto LAB_00159029;
    }
  }
  else {
    if (uVar6 == 0xa24) {
LAB_0015917a:
      pMVar8 = MCInst_getOperand(MI,0);
      uVar7 = MCOperand_getReg(pMVar8);
      if ((uVar7 != 0xc) || (uVar7 = MCInst_getNumOperands(MI), uVar7 < 6))
      goto switchD_00159166_default;
      SStream_concat0(O,"push");
      MCInst_setOpcodePub(MI,0x1aa);
      printPredicateOperand(MI,2,O);
      if (uVar6 == 0xa24) {
LAB_001591de:
        SStream_concat0(O,".w");
      }
      goto LAB_00159029;
    }
    if (uVar6 == 0xaa6) {
      pMVar8 = MCInst_getOperand(MI,0);
      uVar6 = MCOperand_getReg(pMVar8);
      uVar7 = MCInst_getNumOperands(MI);
      bVar4 = true;
      if (3 < uVar7) {
        uVar7 = 3;
        do {
          pMVar8 = MCInst_getOperand(MI,uVar7);
          uVar16 = MCOperand_getReg(pMVar8);
          bVar4 = (bool)(bVar4 & uVar16 != uVar6);
          uVar7 = uVar7 + 1;
          uVar16 = MCInst_getNumOperands(MI);
        } while (uVar7 < uVar16);
      }
      SStream_concat0(O,"ldm");
      MCInst_setOpcodePub(MI,0x39);
      printPredicateOperand(MI,1,O);
      SStream_concat0(O,anon_var_dwarf_73666 + 0x11);
      pcVar10 = (*MI->csh->get_regname)(uVar6);
      SStream_concat0(O,pcVar10);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar3 = MI->flat_insn->detail;
        puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar3 = MI->flat_insn->detail;
        *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
        puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
      if (bVar4) {
        MI->writeback = true;
        SStream_concat0(O,"!");
      }
      SStream_concat0(O,", ");
      uVar6 = 3;
      goto LAB_00159324;
    }
    if (uVar6 != 0xaa2) goto switchD_00159166_default;
  }
LAB_0015913c:
  pMVar8 = MCInst_getOperand(MI,0);
  iVar9 = MCOperand_getImm(pMVar8);
  switch(iVar9) {
  case 0:
    uVar7 = 0x1ab;
    pcVar10 = "nop";
    break;
  case 1:
    uVar7 = 0x1ac;
    pcVar10 = "yield";
    break;
  case 2:
    uVar7 = 0x1ad;
    pcVar10 = "wfe";
    break;
  case 3:
    uVar7 = 0x1ae;
    pcVar10 = "wfi";
    break;
  case 4:
    uVar7 = 0x1af;
    pcVar10 = "sev";
    break;
  case 5:
    uVar15 = ARM_getFeatureBits(MI->csh->mode);
    if ((uVar15 >> 0x2b & 1) == 0) goto switchD_00159166_default;
    uVar7 = 0x1b0;
    pcVar10 = "sevl";
    break;
  default:
switchD_00159166_default:
    printInstruction(MI,O,(MCRegisterInfo *)Info);
    return;
  }
  SStream_concat0(O,pcVar10);
  printPredicateOperand(MI,1,O);
  if (uVar6 == 0x921) {
    SStream_concat0(O,".w");
  }
  MCInst_setOpcodePub(MI,uVar7);
  return;
}

Assistant:

void ARM_printInst(MCInst *MI, SStream *O, void *Info)
{
	MCRegisterInfo *MRI = (MCRegisterInfo *)Info;

	unsigned Opcode = MCInst_getOpcode(MI), tmp, i, pubOpcode;

	switch(Opcode) {
		// Check for HINT instructions w/ canonical names.
		case ARM_HINT:
		case ARM_tHINT:
		case ARM_t2HINT:
			switch (MCOperand_getImm(MCInst_getOperand(MI, 0))) {
				case 0: SStream_concat0(O, "nop"); pubOpcode = ARM_INS_NOP; break;
				case 1: SStream_concat0(O, "yield"); pubOpcode = ARM_INS_YIELD; break;
				case 2: SStream_concat0(O, "wfe"); pubOpcode = ARM_INS_WFE; break;
				case 3: SStream_concat0(O, "wfi"); pubOpcode = ARM_INS_WFI; break;
				case 4: SStream_concat0(O, "sev"); pubOpcode = ARM_INS_SEV; break;
				case 5:
						if ((ARM_getFeatureBits(MI->csh->mode) & ARM_HasV8Ops)) {
							SStream_concat0(O, "sevl");
							pubOpcode = ARM_INS_SEVL;
							break;
						}
						// Fallthrough for non-v8
				default:
						// Anything else should just print normally.
						printInstruction(MI, O, MRI);
						return;
			}
			printPredicateOperand(MI, 1, O);
			if (Opcode == ARM_t2HINT)
				SStream_concat0(O, ".w");

			MCInst_setOpcodePub(MI, pubOpcode);

			return;

			// Check for MOVs and print canonical forms, instead.
		case ARM_MOVsr: {
							// FIXME: Thumb variants?
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);
							MCOperand *MO3 = MCInst_getOperand(MI, 3);

							SStream_concat0(O, ARM_AM_getShiftOpcStr(ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO3))));
							printSBitModifierOperand(MI, 6, O);
							printPredicateOperand(MI, 4, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));

							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO2));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO2);
								MI->flat_insn->detail->arm.op_count++;
							}
							//assert(ARM_AM_getSORegOffset(MO3.getImm()) == 0);
							return;
						}

		case ARM_MOVsi: {
							// FIXME: Thumb variants?
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);

							SStream_concat0(O, ARM_AM_getShiftOpcStr(ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2))));
							printSBitModifierOperand(MI, 5, O);
							printPredicateOperand(MI, 3, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.op_count++;
							}

							if (ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2)) == ARM_AM_rrx) {
								//printAnnotation(O, Annot);
								return;
							}

							SStream_concat0(O, ", ");
							tmp = translateShiftImm(getSORegOffset((unsigned int)MCOperand_getImm(MO2)));
							if (tmp > HEX_THRESHOLD)
								SStream_concat(O, "#0x%x", tmp);
							else
								SStream_concat(O, "#%u", tmp);
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type =
									(arm_shifter)ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2));
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = tmp;
							}
							return;
						}

						// A8.6.123 PUSH
		case ARM_STMDB_UPD:
		case ARM_t2STMDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print PUSH if there are at least two registers in the list.
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2STMDB_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_STR_PRE_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP &&
								MCOperand_getImm(MCInst_getOperand(MI, 3)) == -4) {
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 4, O);
							SStream_concat0(O, "\t{");
							printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 1)));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 1));
								MI->flat_insn->detail->arm.op_count++;
							}
							SStream_concat0(O, "}");
							return;
						}
						break;

						// A8.6.122 POP
		case ARM_LDMIA_UPD:
		case ARM_t2LDMIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print POP if there are at least two registers in the list.
							SStream_concat0(O, "pop");
							MCInst_setOpcodePub(MI, ARM_INS_POP);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2LDMIA_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_LDR_POST_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP) {
							MCOperand *MO2 = MCInst_getOperand(MI, 4);
							if ((getAM2Op((unsigned int)MCOperand_getImm(MO2)) == ARM_AM_add &&
										getAM2Offset((unsigned int)MCOperand_getImm(MO2)) == 4) ||
									MCOperand_getImm(MO2) == 4) {
								SStream_concat0(O, "pop");
								MCInst_setOpcodePub(MI, ARM_INS_POP);
								printPredicateOperand(MI, 5, O);
								SStream_concat0(O, "\t{");
								printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 0)));
								if (MI->csh->detail) {
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 0));
									MI->flat_insn->detail->arm.op_count++;
								}
								SStream_concat0(O, "}");
								return;
							}
						}
						break;

						// A8.6.355 VPUSH
		case ARM_VSTMSDB_UPD:
		case ARM_VSTMDDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpush");
							MCInst_setOpcodePub(MI, ARM_INS_VPUSH);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

						// A8.6.354 VPOP
		case ARM_VLDMSIA_UPD:
		case ARM_VLDMDIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpop");
							MCInst_setOpcodePub(MI, ARM_INS_VPOP);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_tLDMIA: {
							 bool Writeback = true;
							 unsigned BaseReg = MCOperand_getReg(MCInst_getOperand(MI, 0));
							 unsigned i;
							 for (i = 3; i < MCInst_getNumOperands(MI); ++i) {
								 if (MCOperand_getReg(MCInst_getOperand(MI, i)) == BaseReg)
									 Writeback = false;
							 }

							 SStream_concat0(O, "ldm");
							 MCInst_setOpcodePub(MI, ARM_INS_LDM);

							 printPredicateOperand(MI, 1, O);
							 SStream_concat0(O, "\t");
							 printRegName(MI->csh, O, BaseReg);
							 if (MI->csh->detail) {
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = BaseReg;
								 MI->flat_insn->detail->arm.op_count++;
							 }
							 if (Writeback) {
								 MI->writeback = true;
								 SStream_concat0(O, "!");
							 }
							 SStream_concat0(O, ", ");
							 printRegisterList(MI, 3, O);
							 return;
						 }

						 // Combine 2 GPRs from disassember into a GPRPair to match with instr def.
						 // ldrexd/strexd require even/odd GPR pair. To enforce this constraint,
						 // a single GPRPair reg operand is used in the .td file to replace the two
						 // GPRs. However, when decoding them, the two GRPs cannot be automatically
						 // expressed as a GPRPair, so we have to manually merge them.
						 // FIXME: We would really like to be able to tablegen'erate this.
		case ARM_LDREXD:
		case ARM_STREXD:
		case ARM_LDAEXD:
		case ARM_STLEXD: {
				MCRegisterClass* MRC = MCRegisterInfo_getRegClass(MRI, ARM_GPRRegClassID);
				bool isStore = Opcode == ARM_STREXD || Opcode == ARM_STLEXD;

				unsigned Reg = MCOperand_getReg(MCInst_getOperand(MI, isStore ? 1 : 0));
				if (MCRegisterClass_contains(MRC, Reg)) {
				    MCInst NewMI;

				    MCInst_Init(&NewMI);
				    MCInst_setOpcode(&NewMI, Opcode);

				    if (isStore)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, 0));

				    MCOperand_CreateReg0(&NewMI, MCRegisterInfo_getMatchingSuperReg(MRI, Reg, ARM_gsub_0,
								MCRegisterInfo_getRegClass(MRI, ARM_GPRPairRegClassID)));

				    // Copy the rest operands into NewMI.
				    for(i = isStore ? 3 : 2; i < MCInst_getNumOperands(MI); ++i)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, i));

				    printInstruction(&NewMI, O, MRI);
				    return;
				}
		 }
	}

	//if (printAliasInstr(MI, O, MRI))
	//	printInstruction(MI, O, MRI);
	printInstruction(MI, O, MRI);
}